

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O2

void __thiscall wasm::LocalCSE::doWalkFunction(LocalCSE *this,Function *func)

{
  Module *pMVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  __node_type *p_Var4;
  Expression **ppEVar5;
  TaskFunc p_Var6;
  __node_type *p_Var7;
  Expression **ppEVar8;
  char *pcVar9;
  ulong uVar10;
  pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo> *ppVar11;
  PassOptions *pPVar12;
  long *plVar13;
  undefined1 auStack_4f8 [8];
  Scanner scanner;
  Checker checker;
  Applier applier;
  undefined1 local_78 [8];
  RequestInfoMap requestInfos;
  
  pPVar12 = &((this->
              super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
              ).super_Pass.runner)->options;
  local_78 = (undefined1  [8])
             &requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_rehash_policy._M_next_resize;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x1;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_bucket_count = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_element_count._0_4_ = 0x3f800000;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._4_4_ = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_4f8 = (undefined1  [8])0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currModule._0_1_ = 0;
  scanner.options = (PassOptions *)local_78;
  scanner.requestInfos = (RequestInfoMap *)&scanner.activeExprs._M_h._M_rehash_policy._M_next_resize
  ;
  scanner.activeExprs._M_h._M_buckets = (__buckets_ptr)0x1;
  scanner.activeExprs._M_h._M_bucket_count = 0;
  scanner.activeExprs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scanner.activeExprs._M_h._M_element_count._0_4_ = 0x3f800000;
  scanner.activeExprs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  scanner.activeExprs._M_h._M_rehash_policy._4_4_ = 0;
  scanner.activeExprs._M_h._M_rehash_policy._M_next_resize = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ._216_8_ = pPVar12;
  SmallVector<std::pair<unsigned_long,_bool>,_10UL>::SmallVector
            ((SmallVector<std::pair<unsigned_long,_bool>,_10UL> *)
             &scanner.activeExprs._M_h._M_single_bucket);
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
           ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
           super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = SUB81(pMVar1,0);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = (undefined7)((ulong)pMVar1 >> 8);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = SUB81(func,0);
  uVar2 = scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)((ulong)func >> 8);
  uVar3 = scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
  if (((long)scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)scanner.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .replacep != 0) {
    pcVar9 = 
    "void wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Scanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>]"
    ;
LAB_00a73779:
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,pcVar9);
  }
  ppEVar8 = &func->body;
  Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              *)auStack_4f8,
             LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             ::scan,ppEVar8);
  while( true ) {
    if (((long)scanner.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)scanner.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
               .stack.fixed._M_elems[9].currp >> 4) +
        (long)scanner.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .replacep == 0) break;
    if ((pointer)scanner.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                 .stack.fixed._M_elems[9].currp ==
        scanner.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .replacep == (Expression **)0x0) {
        pcVar9 = 
        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, N = 10]"
        ;
        goto LAB_00a73726;
      }
      ppEVar5 = scanner.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .stack.fixed._M_elems
                [(long)scanner.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                       .replacep + -2].currp;
      auStack_4f8 = (undefined1  [8])
                    scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.fixed._M_elems
                    [(long)scanner.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .replacep + -1].func;
      scanner.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .replacep = (Expression **)
                  ((long)scanner.
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .replacep + -1);
    }
    else {
      ppEVar5 = (Expression **)
                scanner.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .stack.flexible.
                super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_4f8 = (undefined1  [8])
                    scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      scanner.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           scanner.
           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
           .
           super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_4f8 == (Expression *)0x0) {
      pcVar9 = 
      "void wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Scanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>]"
      ;
      goto LAB_00a736d9;
    }
    (*(code *)ppEVar5)((Scanner *)auStack_4f8,(Expression **)auStack_4f8);
  }
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = 0;
  if (requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    checker.requestInfos =
         (RequestInfoMap *)&checker.activeOriginals._M_h._M_rehash_policy._M_next_resize;
    scanner.connectAdjacentBlocks = false;
    scanner._489_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .replacep = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currModule._0_1_ = 0;
    checker.options = (PassOptions *)local_78;
    checker.activeOriginals._M_h._M_buckets = (__buckets_ptr)0x1;
    checker.activeOriginals._M_h._M_bucket_count = 0;
    checker.activeOriginals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    checker.activeOriginals._M_h._M_element_count._0_4_ = 0x3f800000;
    checker.activeOriginals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    checker.activeOriginals._M_h._M_rehash_policy._4_4_ = 0;
    checker.activeOriginals._M_h._M_rehash_policy._M_next_resize = 0;
    checker.activeOriginals._M_h._M_single_bucket._0_1_ = 1;
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
             ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
             super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = SUB81(pMVar1,0);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = (undefined7)((ulong)pMVar1 >> 8);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar2;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar3;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ._216_8_ = pPVar12;
    Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                *)&scanner.connectAdjacentBlocks,
               LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               ::scan,ppEVar8);
    while( true ) {
      if (((long)checker.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)checker.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)checker.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                .replacep == 0) break;
      if ((pointer)checker.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          checker.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (checker.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar9 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, N = 10]"
          ;
          goto LAB_00a73726;
        }
        p_Var6 = *(TaskFunc *)
                  ((long)(&checker.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .stack + -1) + 0xb0 +
                  (long)checker.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                        .replacep * 0x10);
        scanner._488_8_ =
             *(undefined8 *)
              ((long)(&checker.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .stack + -1) + 0xb8 +
              (long)checker.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                    .replacep * 0x10);
        checker.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .replacep = (Expression **)
                    ((long)checker.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                           .replacep + -1);
      }
      else {
        p_Var6 = checker.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
        scanner._488_8_ =
             checker.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        checker.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             checker.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)scanner._488_8_ == (Expression *)0x0) {
        pcVar9 = 
        "void wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Checker, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>]"
        ;
        goto LAB_00a736d9;
      }
      (*p_Var6)((Checker *)&scanner.connectAdjacentBlocks,(Expression **)scanner._488_8_);
    }
    if (checker.activeOriginals._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      __assert_fail("activeOriginals.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                    ,0x219,"void wasm::(anonymous namespace)::Checker::visitFunction(Function *)");
    }
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = 0;
    if (requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      checker.connectAdjacentBlocks = false;
      checker._297_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .replacep = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currModule._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .connectAdjacentBlocks = false;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._217_7_ = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_buckets =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_buckets;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_bucket_count = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_before_begin;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_element_count =
           CONCAT44(requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count._4_4_,
                    (undefined4)
                    requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count);
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_max_load_factor =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._M_max_load_factor;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._4_4_ =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._4_4_;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_next_resize = 0;
      ppVar11 = (pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo> *)
                requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_buckets;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._216_8_ = std::
                 _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_allocate_buckets
                           ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)&applier.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .connectAdjacentBlocks,
                            (size_type)
                            requestInfos.
                            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                            ._M_h._M_buckets);
      plVar13 = (long *)requestInfos.
                        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                        ._M_h._M_bucket_count;
      requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_single_bucket =
           (__node_base_ptr)
           applier.
           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
           ._216_8_;
      if (requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count != 0) {
        applier.requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_bucket_count =
             (size_type)
             std::__detail::
             _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::RequestInfo>,false>>>
             ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::RequestInfo>,false>>>
                           *)(requestInfos.
                              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                              ._M_h._M_bucket_count + 8),ppVar11);
        ppVar11 = (pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo> *)
                  &applier.requestInfos.
                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                   ._M_h._M_bucket_count;
        *(pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo> **)
         (applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ._216_8_ +
         (*(ulong *)&(((__node_type *)
                      applier.requestInfos.
                      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                      ._M_h._M_bucket_count)->
                     super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                     ._M_storage._M_storage %
         (ulong)applier.requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_buckets) * 8) = ppVar11;
        p_Var4 = (__node_type *)
                 applier.requestInfos.
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                 ._M_h._M_bucket_count;
        while (p_Var7 = p_Var4, plVar13 = (long *)*plVar13, plVar13 != (long *)0x0) {
          p_Var4 = std::__detail::
                   _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::RequestInfo>,false>>>
                   ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression*const,wasm::(anonymous_namespace)::RequestInfo>,false>>>
                                 *)(plVar13 + 1),ppVar11);
          (p_Var7->super__Hash_node_base)._M_nxt = &p_Var4->super__Hash_node_base;
          uVar10 = *(ulong *)&(p_Var4->
                              super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                              ._M_storage._M_storage %
                   (ulong)applier.requestInfos.
                          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                          ._M_h._M_buckets;
          if (*(long *)(applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        ._216_8_ + uVar10 * 8) == 0) {
            *(__node_type **)
             (applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              ._216_8_ + uVar10 * 8) = p_Var7;
          }
        }
      }
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_single_bucket =
           (__node_base_ptr)&applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize;
      applier.originalLocalMap._M_h._M_buckets = (__buckets_ptr)0x1;
      applier.originalLocalMap._M_h._M_bucket_count = 0;
      applier.originalLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      applier.originalLocalMap._M_h._M_element_count._0_4_ = 0x3f800000;
      applier.originalLocalMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      applier.originalLocalMap._M_h._M_rehash_policy._4_4_ = 0;
      applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
      applier.originalLocalMap._M_h._M_single_bucket._0_1_ = 1;
      pMVar1 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
               ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
               super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = SUB81(pMVar1,0);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = (undefined7)((ulong)pMVar1 >> 8);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar2;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uVar3;
      if (((long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep != 0) {
        pcVar9 = 
        "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
        ;
        goto LAB_00a73779;
      }
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  *)&checker.connectAdjacentBlocks,
                 LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 ::scan,ppEVar8);
      while( true ) {
        if (((long)applier.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start -
             (long)applier.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .stack.fixed._M_elems[9].currp >> 4) +
            (long)applier.
                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  .replacep == 0) break;
        if ((pointer)applier.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            applier.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar9 = 
            "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, N = 10]"
            ;
LAB_00a73726:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,pcVar9);
          }
          ppEVar8 = applier.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .stack.fixed._M_elems
                    [(long)applier.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .replacep + -2].currp;
          checker._296_8_ =
               applier.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .stack.fixed._M_elems
               [(long)applier.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .replacep + -1].func;
          applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .replacep = (Expression **)
                      ((long)applier.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .replacep + -1);
        }
        else {
          ppEVar8 = (Expression **)
                    applier.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].func;
          checker._296_8_ =
               applier.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].currp;
          applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               applier.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        if (*(Expression **)checker._296_8_ == (Expression *)0x0) {
          pcVar9 = 
          "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
          ;
LAB_00a736d9:
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,pcVar9);
        }
        (*(code *)ppEVar8)((Applier *)&checker.connectAdjacentBlocks,(Expression **)checker._296_8_)
        ;
      }
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      anon_unknown_166::Applier::~Applier((Applier *)&checker.connectAdjacentBlocks);
    }
    anon_unknown_166::Checker::~Checker((Checker *)&scanner.connectAdjacentBlocks);
  }
  anon_unknown_166::Scanner::~Scanner((Scanner *)auStack_4f8);
  std::
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ::~unordered_map((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    *)local_78);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    auto& options = getPassOptions();

    RequestInfoMap requestInfos;

    Scanner scanner(options, requestInfos);
    scanner.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // We did not find any repeated expressions at all.
      return;
    }

    Checker checker(options, requestInfos);
    checker.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // No repeated expressions remain after checking for effects.
      return;
    }

    Applier applier(requestInfos);
    applier.walkFunctionInModule(func, getModule());
  }